

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  int iVar4;
  float fVar5;
  undefined4 uVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  byte bVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  AABBNodeMB4D *node1;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  size_t sVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar36;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  float fVar79;
  float fVar80;
  float fVar82;
  float fVar83;
  undefined1 auVar81 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar89;
  uint uVar90;
  float fVar91;
  uint uVar92;
  float fVar93;
  undefined1 auVar88 [16];
  uint uVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar99 [16];
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar106 [64];
  float fVar107;
  float fVar113;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar111;
  float fVar112;
  undefined1 auVar110 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined1 local_14a8 [16];
  long local_1490;
  long local_1488;
  ulong local_1480;
  NodeRef *local_1478;
  undefined1 (*local_1470) [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  float local_13a8 [4];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined8 local_1378;
  undefined8 uStack_1370;
  RTCHitN local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined4 local_1338;
  undefined4 uStack_1334;
  undefined4 uStack_1330;
  undefined4 uStack_132c;
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  uint local_12f8;
  uint uStack_12f4;
  uint uStack_12f0;
  uint uStack_12ec;
  uint uStack_12e8;
  uint uStack_12e4;
  uint uStack_12e0;
  uint uStack_12dc;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  local_1478 = stack + 1;
  stack[0] = root;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_11f8._4_4_ = uVar3;
  local_11f8._0_4_ = uVar3;
  local_11f8._8_4_ = uVar3;
  local_11f8._12_4_ = uVar3;
  local_11f8._16_4_ = uVar3;
  local_11f8._20_4_ = uVar3;
  local_11f8._24_4_ = uVar3;
  local_11f8._28_4_ = uVar3;
  auVar74 = ZEXT3264(local_11f8);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1218._4_4_ = uVar3;
  local_1218._0_4_ = uVar3;
  local_1218._8_4_ = uVar3;
  local_1218._12_4_ = uVar3;
  local_1218._16_4_ = uVar3;
  local_1218._20_4_ = uVar3;
  local_1218._24_4_ = uVar3;
  local_1218._28_4_ = uVar3;
  auVar76 = ZEXT3264(local_1218);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1238._4_4_ = uVar3;
  local_1238._0_4_ = uVar3;
  local_1238._8_4_ = uVar3;
  local_1238._12_4_ = uVar3;
  local_1238._16_4_ = uVar3;
  local_1238._20_4_ = uVar3;
  local_1238._24_4_ = uVar3;
  local_1238._28_4_ = uVar3;
  auVar78 = ZEXT3264(local_1238);
  local_1258 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1278 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1298 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1480 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar33 = local_1480 ^ 0x20;
  iVar4 = (tray->tnear).field_0.i[k];
  local_12b8._4_4_ = iVar4;
  local_12b8._0_4_ = iVar4;
  local_12b8._8_4_ = iVar4;
  local_12b8._12_4_ = iVar4;
  local_12b8._16_4_ = iVar4;
  local_12b8._20_4_ = iVar4;
  local_12b8._24_4_ = iVar4;
  local_12b8._28_4_ = iVar4;
  auVar106 = ZEXT3264(local_12b8);
  iVar4 = (tray->tfar).field_0.i[k];
  local_12d8._4_4_ = iVar4;
  local_12d8._0_4_ = iVar4;
  local_12d8._8_4_ = iVar4;
  local_12d8._12_4_ = iVar4;
  local_12d8._16_4_ = iVar4;
  local_12d8._20_4_ = iVar4;
  local_12d8._24_4_ = iVar4;
  local_12d8._28_4_ = iVar4;
  auVar110 = ZEXT3264(local_12d8);
  local_1470 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar35 = true;
  fStack_1254 = local_1258;
  fStack_1250 = local_1258;
  fStack_124c = local_1258;
  fStack_1248 = local_1258;
  fStack_1244 = local_1258;
  fStack_1240 = local_1258;
  fStack_123c = local_1258;
  fStack_1274 = local_1278;
  fStack_1270 = local_1278;
  fStack_126c = local_1278;
  fStack_1268 = local_1278;
  fStack_1264 = local_1278;
  fStack_1260 = local_1278;
  fStack_125c = local_1278;
  fStack_1294 = local_1298;
  fStack_1290 = local_1298;
  fStack_128c = local_1298;
  fStack_1288 = local_1298;
  fStack_1284 = local_1298;
  fStack_1280 = local_1298;
  fStack_127c = local_1298;
  fVar79 = local_1258;
  fVar43 = local_1258;
  fVar44 = local_1258;
  fVar45 = local_1258;
  fVar85 = local_1258;
  fVar36 = local_1258;
  fVar86 = local_1258;
  fVar87 = local_1278;
  fVar89 = local_1278;
  fVar91 = local_1278;
  fVar93 = local_1278;
  fVar95 = local_1278;
  fVar96 = local_1278;
  fVar97 = local_1278;
  fVar98 = local_1298;
  fVar100 = local_1298;
  fVar101 = local_1298;
  fVar102 = local_1298;
  fVar103 = local_1298;
  fVar104 = local_1298;
  fVar105 = local_1298;
LAB_003f7472:
  do {
    sVar32 = local_1478[-1].ptr;
    local_1478 = local_1478 + -1;
    while ((sVar32 & 8) == 0) {
      uVar27 = sVar32 & 0xfffffffffffffff0;
      fVar5 = *(float *)(ray + k * 4 + 0x70);
      auVar42._4_4_ = fVar5;
      auVar42._0_4_ = fVar5;
      auVar42._8_4_ = fVar5;
      auVar42._12_4_ = fVar5;
      auVar42._16_4_ = fVar5;
      auVar42._20_4_ = fVar5;
      auVar42._24_4_ = fVar5;
      auVar42._28_4_ = fVar5;
      pfVar2 = (float *)(uVar27 + 0x100 + local_1480);
      pfVar1 = (float *)(uVar27 + 0x40 + local_1480);
      auVar55._0_4_ = fVar5 * *pfVar2 + *pfVar1;
      auVar55._4_4_ = fVar5 * pfVar2[1] + pfVar1[1];
      auVar55._8_4_ = fVar5 * pfVar2[2] + pfVar1[2];
      auVar55._12_4_ = fVar5 * pfVar2[3] + pfVar1[3];
      auVar55._16_4_ = fVar5 * pfVar2[4] + pfVar1[4];
      auVar55._20_4_ = fVar5 * pfVar2[5] + pfVar1[5];
      auVar55._24_4_ = fVar5 * pfVar2[6] + pfVar1[6];
      auVar55._28_4_ = in_ZMM1._28_4_ + pfVar1[7];
      auVar55 = vsubps_avx(auVar55,auVar74._0_32_);
      auVar20._4_4_ = fVar43 * auVar55._4_4_;
      auVar20._0_4_ = fVar79 * auVar55._0_4_;
      auVar20._8_4_ = fVar44 * auVar55._8_4_;
      auVar20._12_4_ = fVar45 * auVar55._12_4_;
      auVar20._16_4_ = fVar85 * auVar55._16_4_;
      auVar20._20_4_ = fVar36 * auVar55._20_4_;
      auVar20._24_4_ = fVar86 * auVar55._24_4_;
      auVar20._28_4_ = auVar55._28_4_;
      auVar55 = vmaxps_avx(auVar106._0_32_,auVar20);
      pfVar2 = (float *)(uVar27 + 0x100 + uVar30);
      pfVar1 = (float *)(uVar27 + 0x40 + uVar30);
      auVar64._0_4_ = fVar5 * *pfVar2 + *pfVar1;
      auVar64._4_4_ = fVar5 * pfVar2[1] + pfVar1[1];
      auVar64._8_4_ = fVar5 * pfVar2[2] + pfVar1[2];
      auVar64._12_4_ = fVar5 * pfVar2[3] + pfVar1[3];
      auVar64._16_4_ = fVar5 * pfVar2[4] + pfVar1[4];
      auVar64._20_4_ = fVar5 * pfVar2[5] + pfVar1[5];
      auVar64._24_4_ = fVar5 * pfVar2[6] + pfVar1[6];
      auVar64._28_4_ = in_ZMM2._28_4_ + pfVar1[7];
      auVar20 = vsubps_avx(auVar64,auVar76._0_32_);
      auVar22._4_4_ = fVar89 * auVar20._4_4_;
      auVar22._0_4_ = fVar87 * auVar20._0_4_;
      auVar22._8_4_ = fVar91 * auVar20._8_4_;
      auVar22._12_4_ = fVar93 * auVar20._12_4_;
      auVar22._16_4_ = fVar95 * auVar20._16_4_;
      auVar22._20_4_ = fVar96 * auVar20._20_4_;
      auVar22._24_4_ = fVar97 * auVar20._24_4_;
      auVar22._28_4_ = auVar20._28_4_;
      pfVar2 = (float *)(uVar27 + 0x100 + uVar34);
      pfVar1 = (float *)(uVar27 + 0x40 + uVar34);
      auVar67._0_4_ = fVar5 * *pfVar2 + *pfVar1;
      auVar67._4_4_ = fVar5 * pfVar2[1] + pfVar1[1];
      auVar67._8_4_ = fVar5 * pfVar2[2] + pfVar1[2];
      auVar67._12_4_ = fVar5 * pfVar2[3] + pfVar1[3];
      auVar67._16_4_ = fVar5 * pfVar2[4] + pfVar1[4];
      auVar67._20_4_ = fVar5 * pfVar2[5] + pfVar1[5];
      auVar67._24_4_ = fVar5 * pfVar2[6] + pfVar1[6];
      auVar67._28_4_ = in_ZMM3._28_4_ + pfVar1[7];
      auVar64 = vsubps_avx(auVar67,auVar78._0_32_);
      auVar23._4_4_ = fVar100 * auVar64._4_4_;
      auVar23._0_4_ = fVar98 * auVar64._0_4_;
      auVar23._8_4_ = fVar101 * auVar64._8_4_;
      auVar23._12_4_ = fVar102 * auVar64._12_4_;
      auVar23._16_4_ = fVar103 * auVar64._16_4_;
      auVar23._20_4_ = fVar104 * auVar64._20_4_;
      auVar23._24_4_ = fVar105 * auVar64._24_4_;
      auVar23._28_4_ = auVar64._28_4_;
      auVar20 = vmaxps_avx(auVar22,auVar23);
      auVar55 = vmaxps_avx(auVar55,auVar20);
      pfVar2 = (float *)(uVar27 + 0x100 + uVar33);
      pfVar1 = (float *)(uVar27 + 0x40 + uVar33);
      auVar65._0_4_ = fVar5 * *pfVar2 + *pfVar1;
      auVar65._4_4_ = fVar5 * pfVar2[1] + pfVar1[1];
      auVar65._8_4_ = fVar5 * pfVar2[2] + pfVar1[2];
      auVar65._12_4_ = fVar5 * pfVar2[3] + pfVar1[3];
      auVar65._16_4_ = fVar5 * pfVar2[4] + pfVar1[4];
      auVar65._20_4_ = fVar5 * pfVar2[5] + pfVar1[5];
      auVar65._24_4_ = fVar5 * pfVar2[6] + pfVar1[6];
      auVar65._28_4_ = auVar20._28_4_ + pfVar1[7];
      auVar20 = vsubps_avx(auVar65,auVar74._0_32_);
      auVar24._4_4_ = fVar43 * auVar20._4_4_;
      auVar24._0_4_ = fVar79 * auVar20._0_4_;
      auVar24._8_4_ = fVar44 * auVar20._8_4_;
      auVar24._12_4_ = fVar45 * auVar20._12_4_;
      auVar24._16_4_ = fVar85 * auVar20._16_4_;
      auVar24._20_4_ = fVar36 * auVar20._20_4_;
      auVar24._24_4_ = fVar86 * auVar20._24_4_;
      auVar24._28_4_ = auVar20._28_4_;
      pfVar2 = (float *)(uVar27 + 0x100 + (uVar30 ^ 0x20));
      auVar20 = vminps_avx(auVar110._0_32_,auVar24);
      pfVar1 = (float *)(uVar27 + 0x40 + (uVar30 ^ 0x20));
      auVar68._0_4_ = fVar5 * *pfVar2 + *pfVar1;
      auVar68._4_4_ = fVar5 * pfVar2[1] + pfVar1[1];
      auVar68._8_4_ = fVar5 * pfVar2[2] + pfVar1[2];
      auVar68._12_4_ = fVar5 * pfVar2[3] + pfVar1[3];
      auVar68._16_4_ = fVar5 * pfVar2[4] + pfVar1[4];
      auVar68._20_4_ = fVar5 * pfVar2[5] + pfVar1[5];
      auVar68._24_4_ = fVar5 * pfVar2[6] + pfVar1[6];
      auVar68._28_4_ = auVar64._28_4_ + pfVar1[7];
      auVar64 = vsubps_avx(auVar68,auVar76._0_32_);
      pfVar2 = (float *)(uVar27 + 0x100 + (uVar34 ^ 0x20));
      pfVar1 = (float *)(uVar27 + 0x40 + (uVar34 ^ 0x20));
      auVar71._0_4_ = fVar5 * *pfVar2 + *pfVar1;
      auVar71._4_4_ = fVar5 * pfVar2[1] + pfVar1[1];
      auVar71._8_4_ = fVar5 * pfVar2[2] + pfVar1[2];
      auVar71._12_4_ = fVar5 * pfVar2[3] + pfVar1[3];
      auVar71._16_4_ = fVar5 * pfVar2[4] + pfVar1[4];
      auVar71._20_4_ = fVar5 * pfVar2[5] + pfVar1[5];
      auVar71._24_4_ = fVar5 * pfVar2[6] + pfVar1[6];
      auVar71._28_4_ = in_ZMM4._28_4_ + pfVar1[7];
      auVar25._4_4_ = fVar89 * auVar64._4_4_;
      auVar25._0_4_ = fVar87 * auVar64._0_4_;
      auVar25._8_4_ = fVar91 * auVar64._8_4_;
      auVar25._12_4_ = fVar93 * auVar64._12_4_;
      auVar25._16_4_ = fVar95 * auVar64._16_4_;
      auVar25._20_4_ = fVar96 * auVar64._20_4_;
      auVar25._24_4_ = fVar97 * auVar64._24_4_;
      auVar25._28_4_ = auVar64._28_4_;
      auVar64 = vsubps_avx(auVar71,auVar78._0_32_);
      auVar26._4_4_ = fVar100 * auVar64._4_4_;
      auVar26._0_4_ = fVar98 * auVar64._0_4_;
      auVar26._8_4_ = fVar101 * auVar64._8_4_;
      auVar26._12_4_ = fVar102 * auVar64._12_4_;
      auVar26._16_4_ = fVar103 * auVar64._16_4_;
      auVar26._20_4_ = fVar104 * auVar64._20_4_;
      auVar26._24_4_ = fVar105 * auVar64._24_4_;
      auVar26._28_4_ = auVar64._28_4_;
      in_ZMM4 = ZEXT3264(auVar26);
      auVar64 = vminps_avx(auVar25,auVar26);
      in_ZMM3 = ZEXT3264(auVar64);
      auVar20 = vminps_avx(auVar20,auVar64);
      auVar55 = vcmpps_avx(auVar55,auVar20,2);
      in_ZMM1 = ZEXT3264(auVar55);
      if (((uint)sVar32 & 7) == 6) {
        auVar20 = vcmpps_avx(*(undefined1 (*) [32])(uVar27 + 0x1c0),auVar42,2);
        auVar64 = vcmpps_avx(auVar42,*(undefined1 (*) [32])(uVar27 + 0x1e0),1);
        auVar64 = vandps_avx(auVar20,auVar64);
        auVar55 = vandps_avx(auVar64,auVar55);
        in_ZMM1 = ZEXT1664(auVar55._16_16_);
        auVar37 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
      }
      else {
        auVar37 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
      }
      in_ZMM2 = ZEXT3264(auVar20);
      auVar37 = vpsllw_avx(auVar37,0xf);
      if ((((((((auVar37 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar37 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar37 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar37 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar37 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar37 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar37 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar37[0xf])
      {
        bVar35 = local_1478 != stack;
        if (!bVar35) {
          return bVar35;
        }
        goto LAB_003f7472;
      }
      auVar37 = vpacksswb_avx(auVar37,auVar37);
      bVar21 = SUB161(auVar37 >> 7,0) & 1 | (SUB161(auVar37 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar37 >> 0x17,0) & 1) << 2 | (SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar37 >> 0x27,0) & 1) << 4 | (SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar37 >> 0x37,0) & 1) << 6 | SUB161(auVar37 >> 0x3f,0) << 7;
      lVar29 = 0;
      if (bVar21 != 0) {
        for (; (bVar21 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
        }
      }
      sVar32 = *(size_t *)(uVar27 + lVar29 * 8);
      uVar28 = bVar21 - 1 & (uint)bVar21;
      if (uVar28 != 0) {
        local_1478->ptr = sVar32;
        local_1478 = local_1478 + 1;
        lVar29 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
          }
        }
        sVar32 = *(size_t *)(uVar27 + lVar29 * 8);
        uVar28 = uVar28 - 1 & uVar28;
        uVar31 = (ulong)uVar28;
        if (uVar28 != 0) {
          do {
            local_1478->ptr = sVar32;
            local_1478 = local_1478 + 1;
            lVar29 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
              }
            }
            sVar32 = *(size_t *)(uVar27 + lVar29 * 8);
            uVar31 = uVar31 & uVar31 - 1;
          } while (uVar31 != 0);
        }
      }
    }
    local_1488 = (ulong)((uint)sVar32 & 0xf) - 8;
    if (local_1488 != 0) {
      uVar27 = sVar32 & 0xfffffffffffffff0;
      local_1490 = 0;
      do {
        lVar29 = local_1490 * 0x140;
        fVar79 = *(float *)(ray + k * 4 + 0x70);
        pfVar2 = (float *)(uVar27 + 0x90 + lVar29);
        pfVar1 = (float *)(uVar27 + lVar29);
        auVar72._0_4_ = fVar79 * *pfVar2 + *pfVar1;
        auVar72._4_4_ = fVar79 * pfVar2[1] + pfVar1[1];
        auVar72._8_4_ = fVar79 * pfVar2[2] + pfVar1[2];
        auVar72._12_4_ = fVar79 * pfVar2[3] + pfVar1[3];
        pfVar2 = (float *)(uVar27 + 0xa0 + lVar29);
        pfVar1 = (float *)(uVar27 + 0x10 + lVar29);
        auVar75._0_4_ = fVar79 * *pfVar2 + *pfVar1;
        auVar75._4_4_ = fVar79 * pfVar2[1] + pfVar1[1];
        auVar75._8_4_ = fVar79 * pfVar2[2] + pfVar1[2];
        auVar75._12_4_ = fVar79 * pfVar2[3] + pfVar1[3];
        pfVar2 = (float *)(uVar27 + 0xb0 + lVar29);
        pfVar1 = (float *)(uVar27 + 0x20 + lVar29);
        auVar77._0_4_ = fVar79 * *pfVar2 + *pfVar1;
        auVar77._4_4_ = fVar79 * pfVar2[1] + pfVar1[1];
        auVar77._8_4_ = fVar79 * pfVar2[2] + pfVar1[2];
        auVar77._12_4_ = fVar79 * pfVar2[3] + pfVar1[3];
        pfVar2 = (float *)(uVar27 + 0xc0 + lVar29);
        pfVar1 = (float *)(uVar27 + 0x30 + lVar29);
        auVar37._0_4_ = fVar79 * *pfVar2 + *pfVar1;
        auVar37._4_4_ = fVar79 * pfVar2[1] + pfVar1[1];
        auVar37._8_4_ = fVar79 * pfVar2[2] + pfVar1[2];
        auVar37._12_4_ = fVar79 * pfVar2[3] + pfVar1[3];
        pfVar2 = (float *)(uVar27 + 0xd0 + lVar29);
        pfVar1 = (float *)(uVar27 + 0x40 + lVar29);
        auVar56._0_4_ = fVar79 * *pfVar2 + *pfVar1;
        auVar56._4_4_ = fVar79 * pfVar2[1] + pfVar1[1];
        auVar56._8_4_ = fVar79 * pfVar2[2] + pfVar1[2];
        auVar56._12_4_ = fVar79 * pfVar2[3] + pfVar1[3];
        pfVar2 = (float *)(uVar27 + 0xe0 + lVar29);
        pfVar1 = (float *)(uVar27 + 0x50 + lVar29);
        auVar81._0_4_ = fVar79 * *pfVar2 + *pfVar1;
        auVar81._4_4_ = fVar79 * pfVar2[1] + pfVar1[1];
        auVar81._8_4_ = fVar79 * pfVar2[2] + pfVar1[2];
        auVar81._12_4_ = fVar79 * pfVar2[3] + pfVar1[3];
        pfVar2 = (float *)(uVar27 + 0xf0 + lVar29);
        pfVar1 = (float *)(uVar27 + 0x60 + lVar29);
        auVar88._0_4_ = fVar79 * *pfVar2 + *pfVar1;
        auVar88._4_4_ = fVar79 * pfVar2[1] + pfVar1[1];
        auVar88._8_4_ = fVar79 * pfVar2[2] + pfVar1[2];
        auVar88._12_4_ = fVar79 * pfVar2[3] + pfVar1[3];
        pfVar2 = (float *)(uVar27 + 0x100 + lVar29);
        pfVar1 = (float *)(uVar27 + 0x70 + lVar29);
        auVar99._0_4_ = fVar79 * *pfVar2 + *pfVar1;
        auVar99._4_4_ = fVar79 * pfVar2[1] + pfVar1[1];
        auVar99._8_4_ = fVar79 * pfVar2[2] + pfVar1[2];
        auVar99._12_4_ = fVar79 * pfVar2[3] + pfVar1[3];
        pfVar1 = (float *)(uVar27 + 0x110 + lVar29);
        pfVar2 = (float *)(uVar27 + 0x80 + lVar29);
        auVar38._0_4_ = fVar79 * *pfVar1 + *pfVar2;
        auVar38._4_4_ = fVar79 * pfVar1[1] + pfVar2[1];
        auVar38._8_4_ = fVar79 * pfVar1[2] + pfVar2[2];
        auVar38._12_4_ = fVar79 * pfVar1[3] + pfVar2[3];
        auVar37 = vsubps_avx(auVar72,auVar37);
        auVar46 = vsubps_avx(auVar75,auVar56);
        auVar40 = vsubps_avx(auVar77,auVar81);
        auVar56 = vsubps_avx(auVar88,auVar72);
        auVar41 = vsubps_avx(auVar99,auVar75);
        auVar38 = vsubps_avx(auVar38,auVar77);
        fVar45 = auVar38._0_4_;
        fVar107 = auVar46._0_4_;
        auVar39._0_4_ = fVar107 * fVar45;
        fVar93 = auVar38._4_4_;
        fVar111 = auVar46._4_4_;
        auVar39._4_4_ = fVar111 * fVar93;
        fVar102 = auVar38._8_4_;
        fVar112 = auVar46._8_4_;
        auVar39._8_4_ = fVar112 * fVar102;
        fVar13 = auVar38._12_4_;
        fVar113 = auVar46._12_4_;
        auVar39._12_4_ = fVar113 * fVar13;
        fVar85 = auVar41._0_4_;
        fVar80 = auVar40._0_4_;
        auVar46._0_4_ = fVar80 * fVar85;
        fVar95 = auVar41._4_4_;
        fVar82 = auVar40._4_4_;
        auVar46._4_4_ = fVar82 * fVar95;
        fVar103 = auVar41._8_4_;
        fVar83 = auVar40._8_4_;
        auVar46._8_4_ = fVar83 * fVar103;
        fVar14 = auVar41._12_4_;
        fVar84 = auVar40._12_4_;
        auVar46._12_4_ = fVar84 * fVar14;
        local_1398 = vsubps_avx(auVar46,auVar39);
        fVar36 = auVar56._0_4_;
        auVar47._0_4_ = fVar80 * fVar36;
        fVar96 = auVar56._4_4_;
        auVar47._4_4_ = fVar82 * fVar96;
        fVar104 = auVar56._8_4_;
        auVar47._8_4_ = fVar83 * fVar104;
        fVar15 = auVar56._12_4_;
        auVar47._12_4_ = fVar84 * fVar15;
        fVar86 = auVar37._0_4_;
        auVar57._0_4_ = fVar45 * fVar86;
        fVar97 = auVar37._4_4_;
        auVar57._4_4_ = fVar93 * fVar97;
        fVar105 = auVar37._8_4_;
        auVar57._8_4_ = fVar102 * fVar105;
        fVar16 = auVar37._12_4_;
        auVar57._12_4_ = fVar13 * fVar16;
        local_1388 = vsubps_avx(auVar57,auVar47);
        auVar58._0_4_ = fVar85 * fVar86;
        auVar58._4_4_ = fVar95 * fVar97;
        auVar58._8_4_ = fVar103 * fVar105;
        auVar58._12_4_ = fVar14 * fVar16;
        auVar108._0_4_ = fVar107 * fVar36;
        auVar108._4_4_ = fVar111 * fVar96;
        auVar108._8_4_ = fVar112 * fVar104;
        auVar108._12_4_ = fVar113 * fVar15;
        auVar56 = vsubps_avx(auVar108,auVar58);
        uVar3 = *(undefined4 *)(ray + k * 4);
        auVar109._4_4_ = uVar3;
        auVar109._0_4_ = uVar3;
        auVar109._8_4_ = uVar3;
        auVar109._12_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar114._4_4_ = uVar3;
        auVar114._0_4_ = uVar3;
        auVar114._8_4_ = uVar3;
        auVar114._12_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar116._4_4_ = uVar3;
        auVar116._0_4_ = uVar3;
        auVar116._8_4_ = uVar3;
        auVar116._12_4_ = uVar3;
        fVar79 = *(float *)(ray + k * 4 + 0x50);
        auVar37 = vsubps_avx(auVar72,auVar109);
        fVar43 = *(float *)(ray + k * 4 + 0x60);
        auVar46 = vsubps_avx(auVar75,auVar114);
        auVar40 = vsubps_avx(auVar77,auVar116);
        fVar87 = auVar40._0_4_;
        auVar115._0_4_ = fVar79 * fVar87;
        fVar98 = auVar40._4_4_;
        auVar115._4_4_ = fVar79 * fVar98;
        fVar5 = auVar40._8_4_;
        auVar115._8_4_ = fVar79 * fVar5;
        fVar17 = auVar40._12_4_;
        auVar115._12_4_ = fVar79 * fVar17;
        fVar89 = auVar46._0_4_;
        auVar117._0_4_ = fVar43 * fVar89;
        fVar100 = auVar46._4_4_;
        auVar117._4_4_ = fVar43 * fVar100;
        fVar11 = auVar46._8_4_;
        auVar117._8_4_ = fVar43 * fVar11;
        fVar18 = auVar46._12_4_;
        auVar117._12_4_ = fVar43 * fVar18;
        auVar46 = vsubps_avx(auVar117,auVar115);
        fVar44 = *(float *)(ray + k * 4 + 0x40);
        fVar91 = auVar37._0_4_;
        auVar40._0_4_ = fVar43 * fVar91;
        fVar101 = auVar37._4_4_;
        auVar40._4_4_ = fVar43 * fVar101;
        fVar12 = auVar37._8_4_;
        auVar40._8_4_ = fVar43 * fVar12;
        fVar19 = auVar37._12_4_;
        auVar40._12_4_ = fVar43 * fVar19;
        auVar48._0_4_ = fVar44 * fVar87;
        auVar48._4_4_ = fVar44 * fVar98;
        auVar48._8_4_ = fVar44 * fVar5;
        auVar48._12_4_ = fVar44 * fVar17;
        auVar40 = vsubps_avx(auVar48,auVar40);
        auVar49._0_4_ = fVar44 * fVar89;
        auVar49._4_4_ = fVar44 * fVar100;
        auVar49._8_4_ = fVar44 * fVar11;
        auVar49._12_4_ = fVar44 * fVar18;
        auVar59._0_4_ = fVar79 * fVar91;
        auVar59._4_4_ = fVar79 * fVar101;
        auVar59._8_4_ = fVar79 * fVar12;
        auVar59._12_4_ = fVar79 * fVar19;
        auVar41 = vsubps_avx(auVar59,auVar49);
        auVar60._0_4_ =
             fVar44 * local_1398._0_4_ + fVar79 * local_1388._0_4_ + fVar43 * auVar56._0_4_;
        auVar60._4_4_ =
             fVar44 * local_1398._4_4_ + fVar79 * local_1388._4_4_ + fVar43 * auVar56._4_4_;
        auVar60._8_4_ =
             fVar44 * local_1398._8_4_ + fVar79 * local_1388._8_4_ + fVar43 * auVar56._8_4_;
        auVar60._12_4_ =
             fVar44 * local_1398._12_4_ + fVar79 * local_1388._12_4_ + fVar43 * auVar56._12_4_;
        in_ZMM2 = ZEXT1664(auVar60);
        auVar50._8_4_ = 0x80000000;
        auVar50._0_8_ = 0x8000000080000000;
        auVar50._12_4_ = 0x80000000;
        auVar37 = vandps_avx(auVar60,auVar50);
        uVar28 = auVar37._0_4_;
        auVar66._0_4_ =
             (float)(uVar28 ^ (uint)(fVar36 * auVar46._0_4_ +
                                    fVar45 * auVar41._0_4_ + fVar85 * auVar40._0_4_));
        uVar90 = auVar37._4_4_;
        auVar66._4_4_ =
             (float)(uVar90 ^ (uint)(fVar96 * auVar46._4_4_ +
                                    fVar93 * auVar41._4_4_ + fVar95 * auVar40._4_4_));
        uVar92 = auVar37._8_4_;
        auVar66._8_4_ =
             (float)(uVar92 ^ (uint)(fVar104 * auVar46._8_4_ +
                                    fVar102 * auVar41._8_4_ + fVar103 * auVar40._8_4_));
        uVar94 = auVar37._12_4_;
        auVar66._12_4_ =
             (float)(uVar94 ^ (uint)(fVar15 * auVar46._12_4_ +
                                    fVar13 * auVar41._12_4_ + fVar14 * auVar40._12_4_));
        in_ZMM3 = ZEXT1664(auVar66);
        auVar69._0_4_ =
             (float)(uVar28 ^ (uint)(auVar46._0_4_ * fVar86 +
                                    fVar80 * auVar41._0_4_ + auVar40._0_4_ * fVar107));
        auVar69._4_4_ =
             (float)(uVar90 ^ (uint)(auVar46._4_4_ * fVar97 +
                                    fVar82 * auVar41._4_4_ + auVar40._4_4_ * fVar111));
        auVar69._8_4_ =
             (float)(uVar92 ^ (uint)(auVar46._8_4_ * fVar105 +
                                    fVar83 * auVar41._8_4_ + auVar40._8_4_ * fVar112));
        auVar69._12_4_ =
             (float)(uVar94 ^ (uint)(auVar46._12_4_ * fVar16 +
                                    fVar84 * auVar41._12_4_ + auVar40._12_4_ * fVar113));
        in_ZMM4 = ZEXT1664(auVar69);
        auVar40 = ZEXT416(0) << 0x20;
        auVar37 = vcmpps_avx(auVar66,auVar40,5);
        auVar46 = vcmpps_avx(auVar69,auVar40,5);
        auVar37 = vandps_avx(auVar37,auVar46);
        auVar51._8_4_ = 0x7fffffff;
        auVar51._0_8_ = 0x7fffffff7fffffff;
        auVar51._12_4_ = 0x7fffffff;
        auVar46 = vandps_avx(auVar60,auVar51);
        auVar40 = vcmpps_avx(auVar40,auVar60,4);
        in_ZMM1 = ZEXT1664(auVar40);
        auVar37 = vandps_avx(auVar37,auVar40);
        auVar41._0_4_ = auVar66._0_4_ + auVar69._0_4_;
        auVar41._4_4_ = auVar66._4_4_ + auVar69._4_4_;
        auVar41._8_4_ = auVar66._8_4_ + auVar69._8_4_;
        auVar41._12_4_ = auVar66._12_4_ + auVar69._12_4_;
        auVar40 = vcmpps_avx(auVar41,auVar46,2);
        auVar41 = auVar40 & auVar37;
        if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar41[0xf] < '\0') {
          auVar37 = vandps_avx(auVar37,auVar40);
          auVar73._0_4_ =
               (float)(uVar28 ^ (uint)(local_1398._0_4_ * fVar91 +
                                      local_1388._0_4_ * fVar89 + fVar87 * auVar56._0_4_));
          auVar73._4_4_ =
               (float)(uVar90 ^ (uint)(local_1398._4_4_ * fVar101 +
                                      local_1388._4_4_ * fVar100 + fVar98 * auVar56._4_4_));
          auVar73._8_4_ =
               (float)(uVar92 ^ (uint)(local_1398._8_4_ * fVar12 +
                                      local_1388._8_4_ * fVar11 + fVar5 * auVar56._8_4_));
          auVar73._12_4_ =
               (float)(uVar94 ^ (uint)(local_1398._12_4_ * fVar19 +
                                      local_1388._12_4_ * fVar18 + fVar17 * auVar56._12_4_));
          fVar79 = *(float *)(ray + k * 4 + 0x30);
          fVar43 = auVar46._0_4_;
          auVar52._0_4_ = fVar43 * fVar79;
          fVar44 = auVar46._4_4_;
          auVar52._4_4_ = fVar44 * fVar79;
          fVar45 = auVar46._8_4_;
          auVar52._8_4_ = fVar45 * fVar79;
          fVar85 = auVar46._12_4_;
          auVar52._12_4_ = fVar85 * fVar79;
          auVar40 = vcmpps_avx(auVar52,auVar73,1);
          fVar79 = *(float *)(ray + k * 4 + 0x80);
          auVar61._0_4_ = fVar43 * fVar79;
          auVar61._4_4_ = fVar44 * fVar79;
          auVar61._8_4_ = fVar45 * fVar79;
          auVar61._12_4_ = fVar85 * fVar79;
          auVar41 = vcmpps_avx(auVar73,auVar61,2);
          in_ZMM2 = ZEXT1664(auVar41);
          auVar40 = vandps_avx(auVar40,auVar41);
          in_ZMM1 = ZEXT1664(auVar40);
          auVar37 = vandps_avx(auVar40,auVar37);
          uVar28 = vmovmskps_avx(auVar37);
          if (uVar28 != 0) {
            local_14f8 = auVar56._0_8_;
            uStack_14f0 = auVar56._8_8_;
            local_1378 = local_14f8;
            uStack_1370 = uStack_14f0;
            pSVar7 = context->scene;
            auVar37 = vrcpps_avx(auVar46);
            fVar36 = auVar37._0_4_;
            auVar53._0_4_ = fVar43 * fVar36;
            fVar43 = auVar37._4_4_;
            auVar53._4_4_ = fVar44 * fVar43;
            fVar44 = auVar37._8_4_;
            auVar53._8_4_ = fVar45 * fVar44;
            fVar45 = auVar37._12_4_;
            auVar53._12_4_ = fVar85 * fVar45;
            auVar62._8_4_ = 0x3f800000;
            auVar62._0_8_ = 0x3f8000003f800000;
            auVar62._12_4_ = 0x3f800000;
            in_ZMM2 = ZEXT1664(auVar62);
            auVar37 = vsubps_avx(auVar62,auVar53);
            fVar36 = fVar36 + fVar36 * auVar37._0_4_;
            fVar43 = fVar43 + fVar43 * auVar37._4_4_;
            fVar44 = fVar44 + fVar44 * auVar37._8_4_;
            fVar45 = fVar45 + fVar45 * auVar37._12_4_;
            local_13a8[0] = fVar36 * auVar73._0_4_;
            local_13a8[1] = fVar43 * auVar73._4_4_;
            local_13a8[2] = fVar44 * auVar73._8_4_;
            local_13a8[3] = fVar45 * auVar73._12_4_;
            local_13c8._0_4_ = fVar36 * auVar66._0_4_;
            local_13c8._4_4_ = fVar43 * auVar66._4_4_;
            local_13c8._8_4_ = fVar44 * auVar66._8_4_;
            local_13c8._12_4_ = fVar45 * auVar66._12_4_;
            in_ZMM1 = ZEXT1664(local_13c8);
            local_13b8._0_4_ = fVar36 * auVar69._0_4_;
            local_13b8._4_4_ = fVar43 * auVar69._4_4_;
            local_13b8._8_4_ = fVar44 * auVar69._8_4_;
            local_13b8._12_4_ = fVar45 * auVar69._12_4_;
            uVar31 = (ulong)(uVar28 & 0xff);
            do {
              uVar10 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              uVar28 = *(uint *)(lVar29 + uVar27 + 0x120 + uVar10 * 4);
              pGVar8 = (pSVar7->geometries).items[uVar28].ptr;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_003f7ced:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar35;
                }
                local_1338 = *(undefined4 *)(local_13c8 + uVar10 * 4);
                uVar3 = *(undefined4 *)(local_13b8 + uVar10 * 4);
                local_1328._4_4_ = uVar3;
                local_1328._0_4_ = uVar3;
                local_1328._8_4_ = uVar3;
                local_1328._12_4_ = uVar3;
                in_ZMM2 = ZEXT1664(local_1328);
                *(float *)(ray + k * 4 + 0x80) = local_13a8[uVar10];
                args.context = context->user;
                local_1308 = vshufps_avx(ZEXT416(uVar28),ZEXT416(uVar28),0);
                uVar3 = *(undefined4 *)(lVar29 + uVar27 + 0x130 + uVar10 * 4);
                local_1318._4_4_ = uVar3;
                local_1318._0_4_ = uVar3;
                local_1318._8_4_ = uVar3;
                local_1318._12_4_ = uVar3;
                in_ZMM3 = ZEXT1664(local_1318);
                uVar3 = *(undefined4 *)(local_1398 + uVar10 * 4);
                auVar70._4_4_ = uVar3;
                auVar70._0_4_ = uVar3;
                auVar70._8_4_ = uVar3;
                auVar70._12_4_ = uVar3;
                in_ZMM4 = ZEXT1664(auVar70);
                uVar6 = *(undefined4 *)(local_1388 + uVar10 * 4);
                local_1358._4_4_ = uVar6;
                local_1358._0_4_ = uVar6;
                local_1358._8_4_ = uVar6;
                local_1358._12_4_ = uVar6;
                uVar6 = *(undefined4 *)((long)&local_1378 + uVar10 * 4);
                local_1348._4_4_ = uVar6;
                local_1348._0_4_ = uVar6;
                local_1348._8_4_ = uVar6;
                local_1348._12_4_ = uVar6;
                local_1368[0] = (RTCHitN)(char)uVar3;
                local_1368[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1368[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1368[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1368[4] = (RTCHitN)(char)uVar3;
                local_1368[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1368[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1368[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1368[8] = (RTCHitN)(char)uVar3;
                local_1368[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1368[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1368[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1368[0xc] = (RTCHitN)(char)uVar3;
                local_1368[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1368[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1368[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                uStack_1334 = local_1338;
                uStack_1330 = local_1338;
                uStack_132c = local_1338;
                vcmpps_avx(ZEXT1632(local_1308),ZEXT1632(local_1308),0xf);
                uStack_12f4 = (args.context)->instID[0];
                local_12f8 = uStack_12f4;
                uStack_12f0 = uStack_12f4;
                uStack_12ec = uStack_12f4;
                uStack_12e8 = (args.context)->instPrimID[0];
                uStack_12e4 = uStack_12e8;
                uStack_12e0 = uStack_12e8;
                uStack_12dc = uStack_12e8;
                local_14a8 = *local_1470;
                args.valid = (int *)local_14a8;
                args.geometryUserPtr = pGVar8->userPtr;
                args.hit = local_1368;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  in_ZMM2 = ZEXT1664(local_1328);
                  in_ZMM3 = ZEXT1664(local_1318);
                  in_ZMM4 = ZEXT1664(auVar70);
                  (*pGVar8->occlusionFilterN)(&args);
                }
                if (local_14a8 == (undefined1  [16])0x0) {
                  auVar37 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar37 = auVar37 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var9 = context->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                    in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                    (*p_Var9)(&args);
                  }
                  auVar46 = vpcmpeqd_avx(local_14a8,_DAT_01f7aa10);
                  auVar37 = auVar46 ^ _DAT_01f7ae20;
                  auVar63._8_4_ = 0xff800000;
                  auVar63._0_8_ = 0xff800000ff800000;
                  auVar63._12_4_ = 0xff800000;
                  in_ZMM2 = ZEXT1664(auVar63);
                  auVar46 = vblendvps_avx(auVar63,*(undefined1 (*) [16])(args.ray + 0x80),auVar46);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar46;
                }
                auVar54._8_8_ = 0x100000001;
                auVar54._0_8_ = 0x100000001;
                in_ZMM1 = ZEXT1664(auVar54);
                if ((auVar54 & auVar37) != (undefined1  [16])0x0) goto LAB_003f7ced;
                *(float *)(ray + k * 4 + 0x80) = fVar79;
              }
              uVar31 = uVar31 ^ 1L << (uVar10 & 0x3f);
            } while (uVar31 != 0);
          }
        }
        local_1490 = local_1490 + 1;
      } while (local_1490 != local_1488);
    }
    bVar35 = local_1478 != stack;
    auVar74 = ZEXT3264(local_11f8);
    auVar76 = ZEXT3264(local_1218);
    auVar78 = ZEXT3264(local_1238);
    auVar106 = ZEXT3264(local_12b8);
    auVar110 = ZEXT3264(local_12d8);
    fVar79 = local_1258;
    fVar43 = fStack_1254;
    fVar44 = fStack_1250;
    fVar45 = fStack_124c;
    fVar85 = fStack_1248;
    fVar36 = fStack_1244;
    fVar86 = fStack_1240;
    fVar87 = local_1278;
    fVar89 = fStack_1274;
    fVar91 = fStack_1270;
    fVar93 = fStack_126c;
    fVar95 = fStack_1268;
    fVar96 = fStack_1264;
    fVar97 = fStack_1260;
    fVar98 = local_1298;
    fVar100 = fStack_1294;
    fVar101 = fStack_1290;
    fVar102 = fStack_128c;
    fVar103 = fStack_1288;
    fVar104 = fStack_1284;
    fVar105 = fStack_1280;
    if (!bVar35) {
      return bVar35;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }